

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall
chrono::ChMarker::ChMarker
          (ChMarker *this,string *name,ChBody *body,ChCoordsys<double> *rel_pos,
          ChCoordsys<double> *rel_pos_dt,ChCoordsys<double> *rel_pos_dtdt)

{
  ChFrameMoving<double> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  ChObj::ChObj(&this->super_ChObj);
  this_00 = &this->super_ChFrameMoving<double>;
  local_50.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(this_00,&local_68,&local_50);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_00b034b0;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_00b034f0;
  (this->rest_coord).pos.m_data[0] = 0.0;
  (this->rest_coord).pos.m_data[1] = 0.0;
  (this->rest_coord).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->rest_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord_dt).rot.m_data[0] = 1.0;
  (this->last_rel_coord_dt).rot.m_data[1] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[2] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[3] = 0.0;
  local_50.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->abs_frame,&local_68,&local_50);
  std::__cxx11::string::_M_assign((string *)&(this->super_ChObj).m_name);
  this->Body = body;
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  dVar2 = DAT_00b689e8;
  if (this != (ChMarker *)&DAT_00b68868) {
    (this->motion_axis).m_data[0] = VECT_Z;
    (this->motion_axis).m_data[1] = dVar2;
    (this->motion_axis).m_data[2] = DAT_00b689f0;
  }
  uVar7 = CSYSNORM._24_8_;
  uVar6 = CSYSNORM._16_8_;
  uVar5 = CSYSNORM._8_8_;
  if (this != (ChMarker *)(Q_ROTATE_Y_TO_Z + 0x10)) {
    (this->rest_coord).pos.m_data[0] = (double)CSYSNORM._0_8_;
    (this->rest_coord).pos.m_data[1] = (double)uVar5;
    (this->rest_coord).pos.m_data[2] = (double)uVar6;
    (this->rest_coord).rot.m_data[0] = (double)uVar7;
    uVar5 = CSYSNORM._40_8_;
    (this->rest_coord).rot.m_data[1] = (double)CSYSNORM._32_8_;
    (this->rest_coord).rot.m_data[2] = (double)uVar5;
    (this->rest_coord).rot.m_data[3] = (double)CSYSNORM._48_8_;
  }
  this->motion_type = M_MOTION_FUNCTIONS;
  ChFrame<double>::SetCoord(&this_00->super_ChFrame<double>,rel_pos);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[6])(this_00,rel_pos_dt);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[0xb])(this_00,rel_pos_dtdt);
  uVar7 = CSYSNORM._24_8_;
  uVar6 = CSYSNORM._16_8_;
  uVar5 = CSYSNORM._8_8_;
  if (this != (ChMarker *)&DAT_00b68868) {
    (this->last_rel_coord).pos.m_data[0] = (double)CSYSNORM._0_8_;
    (this->last_rel_coord).pos.m_data[1] = (double)uVar5;
    (this->last_rel_coord).pos.m_data[2] = (double)uVar6;
    (this->last_rel_coord).rot.m_data[0] = (double)uVar7;
    uVar5 = CSYSNORM._40_8_;
    (this->last_rel_coord).rot.m_data[1] = (double)CSYSNORM._32_8_;
    (this->last_rel_coord).rot.m_data[2] = (double)uVar5;
    (this->last_rel_coord).rot.m_data[3] = (double)CSYSNORM._48_8_;
  }
  dVar4 = _DAT_00b68a18;
  dVar3 = _DAT_00b68a10;
  dVar2 = _DAT_00b68a08;
  if (this != (ChMarker *)(ChFile_ps_color::WHITE + 8)) {
    (this->last_rel_coord_dt).pos.m_data[0] = CSYSNULL;
    (this->last_rel_coord_dt).pos.m_data[1] = dVar2;
    (this->last_rel_coord_dt).pos.m_data[2] = dVar3;
    (this->last_rel_coord_dt).rot.m_data[0] = dVar4;
    dVar2 = _DAT_00b68a28;
    (this->last_rel_coord_dt).rot.m_data[1] = _DAT_00b68a20;
    (this->last_rel_coord_dt).rot.m_data[2] = dVar2;
    (this->last_rel_coord_dt).rot.m_data[3] = DAT_00b68a30;
  }
  this->last_time = 0.0;
  if (this->Body != (ChBody *)0x0) {
    ChFrameMoving<double>::TransformLocalToParent
              (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,this_00,&this->abs_frame
              );
  }
  return;
}

Assistant:

ChMarker::ChMarker(const std::string& name,
                   ChBody* body,
                   const ChCoordsys<>& rel_pos,
                   const ChCoordsys<>& rel_pos_dt,
                   const ChCoordsys<>& rel_pos_dtdt) {
    SetNameString(name);
    Body = body;

    motion_X = chrono_types::make_shared<ChFunction_Const>(0);  // default: no motion
    motion_Y = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_Z = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_ang = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_axis = VECT_Z;

    rest_coord = CSYSNORM;

    motion_type = M_MOTION_FUNCTIONS;

    SetCoord(rel_pos);
    SetCoord_dt(rel_pos_dt);
    SetCoord_dtdt(rel_pos_dtdt);

    last_rel_coord = CSYSNORM;
    last_rel_coord_dt = CSYSNULL;
    last_time = 0;

    UpdateState();
}